

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

obj * bp_to_obj(bill_x *bp)

{
  obj *poVar1;
  
  if (bp->useup != '\0') {
    poVar1 = o_on(bp->bo_id,level->billobjs);
    return poVar1;
  }
  poVar1 = find_oid(level,bp->bo_id);
  return poVar1;
}

Assistant:

static struct obj *bp_to_obj(struct bill_x *bp)
{
	struct obj *obj;
	unsigned int id = bp->bo_id;

	if (bp->useup)
		obj = o_on(id, level->billobjs);
	else
		obj = find_oid(level, id);
	return obj;
}